

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O3

int set_command_and_move_old_owner_proc(Am_Object *self)

{
  bool bVar1;
  Am_Value *pAVar2;
  Am_Wrapper *pAVar3;
  Am_Object cmd;
  Am_Object local_10;
  
  local_10.data = (Am_Object_Data *)0x0;
  pAVar2 = Am_Object::Get(self,0xc5,0);
  Am_Object::operator=(&local_10,pAVar2);
  bVar1 = Am_Object::Valid(&local_10);
  if (bVar1) {
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(self);
    Am_Object::Set(&local_10,0x170,pAVar3,1);
  }
  pAVar2 = Am_Object::Get(self,0x195,0);
  Am_Object::operator=(&local_10,pAVar2);
  bVar1 = Am_Object::Valid(&local_10);
  if (bVar1) {
    pAVar3 = Am_Object::operator_cast_to_Am_Wrapper_(self);
    Am_Object::Set(&local_10,0x170,pAVar3,1);
  }
  Am_Object::~Am_Object(&local_10);
  return 1;
}

Assistant:

Am_Define_Formula(int, set_command_and_move_old_owner)
{
  Am_Object cmd;
  cmd = self.Get(Am_COMMAND);
  if (cmd.Valid())
    cmd.Set(Am_SAVED_OLD_OWNER, self, Am_OK_IF_NOT_THERE);
  cmd = self.Get(Am_MOVE_GROW_COMMAND);
  if (cmd.Valid())
    cmd.Set(Am_SAVED_OLD_OWNER, self, Am_OK_IF_NOT_THERE);
  return 1;
}